

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isoent_free_all(isoent *isoent)

{
  isoent *piVar1;
  bool bVar2;
  isoent *np_temp;
  isoent *np;
  isoent *isoent_local;
  
  np_temp = isoent;
  if (isoent == (isoent *)0x0) {
    return;
  }
  do {
    for (; ((char)(np_temp->field_0xe8 << 6) < '\0' && ((np_temp->children).first != (isoent *)0x0))
        ; np_temp = (np_temp->children).first) {
    }
    while (np_temp->chnext == (isoent *)0x0) {
      piVar1 = np_temp->parent;
      _isoent_free(np_temp);
      bVar2 = piVar1 == np_temp;
      np_temp = piVar1;
      if (bVar2) {
        return;
      }
    }
    piVar1 = np_temp->chnext;
    _isoent_free(np_temp);
    np_temp = piVar1;
  } while( true );
}

Assistant:

static void
isoent_free_all(struct isoent *isoent)
{
	struct isoent *np, *np_temp;

	if (isoent == NULL)
		return;
	np = isoent;
	for (;;) {
		if (np->dir) {
			if (np->children.first != NULL) {
				/* Enter to sub directories. */
				np = np->children.first;
				continue;
			}
		}
		for (;;) {
			np_temp = np;
			if (np->chnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				_isoent_free(np_temp);
				if (np == np_temp)
					return;
			} else {
				np = np->chnext;
				_isoent_free(np_temp);
				break;
			}
		}
	}
}